

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVarSup.cpp
# Opt level: O2

ClauseIterator __thiscall Inferences::SubVarSup::generateClauses(SubVarSup *this,Clause *premise)

{
  Clause *in_RDX;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  *i;
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  *i_00;
  ForwardResultFn f;
  BackwardResultFn f_00;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  itb;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  itf;
  undefined1 local_5f0 [224];
  RewriteableSubtermsFn local_510;
  undefined1 local_4e0 [224];
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>
  local_400;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>
  local_380;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>
  local_328;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>
  local_2d0;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>
  local_278;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>
  local_220;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>
  local_1a0;
  IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>,_Lib::NonzeroFn,_false>_>
  local_120;
  
  local_400._inner._master._func._index._0_4_ = *(uint *)&in_RDX->field_0x3c & 0xfffff;
  local_400._func._parent = (SubVarSup *)0x0;
  RewriteableSubtermsFn::RewriteableSubtermsFn
            (&local_510,*(Ordering **)(*(long *)&(premise->super_Unit)._inference + 0xb8),in_RDX);
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::flatMap<Inferences::SubVarSup::RewriteableSubtermsFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_4e0,
             (IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
              *)&local_400,&local_510);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::flatMap<Inferences::SubVarSup::ApplicableRewritesFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_5f0,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_4e0,(SubVarSupLHSIndex *)(premise->super_Unit)._inference._splits);
  f._parent = (SubVarSup *)premise;
  f._cl = in_RDX;
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::map<Inferences::SubVarSup::ForwardResultFn>
            ((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
              *)&local_1a0,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_5f0,f);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_5f0);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>
              *)local_4e0);
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_510);
  local_400._inner._master._func._index._0_4_ = *(uint *)&in_RDX->field_0x3c & 0xfffff;
  local_400._func._parent = (SubVarSup *)0x0;
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::flatMap<Kernel::EqHelper::SubVarSupLHSIteratorFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_4e0,
             (IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
              *)&local_400,*(Ordering **)(*(long *)&(premise->super_Unit)._inference + 0xb8));
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::flatMap<Inferences::SubVarSup::RewritableResultsFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_5f0,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_4e0,*(SubVarSupSubtermIndex **)&(premise->super_Unit)._inference.field_0x8);
  f_00._parent = (SubVarSup *)premise;
  f_00._cl = in_RDX;
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::map<Inferences::SubVarSup::BackwardResultFn>
            ((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
              *)&local_328,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_5f0,f_00);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_5f0);
  Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>::
  ~OptionBase((OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
               *)(local_4e0 + 0x20));
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>
  ::MappingIterator(&local_220,&local_1a0);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>
  ::MappingIterator(&local_380,&local_328);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>
  ::MappingIterator(&local_400,&local_220);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>
  ::MappingIterator(&local_2d0,&local_380);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>
  ::MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>
                     *)local_5f0,&local_2d0);
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>
            (&local_278,(Lib *)local_5f0,i);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)(local_5f0 + 0x10));
  Lib::
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  ::CatIterator((CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
                 *)local_5f0,
                (IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
                 *)&local_400,&local_278);
  Lib::
  iterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::SubVarSup::RewriteableSubtermsFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::ApplicableRewritesFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::ForwardResultFn,Kernel::Clause*>>,Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>>>
            ((IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
              *)local_4e0,(Lib *)local_5f0,i_00);
  Lib::
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  ::~CatIterator((CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
                  *)local_5f0);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_278._iter._iter._inner);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_2d0._inner);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_400._inner);
  Lib::
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
  ::filter<Lib::NonzeroFn>
            (&local_120,
             (IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
              *)local_4e0);
  Lib::
  pvi<Lib::IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::SubVarSup::RewriteableSubtermsFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::ApplicableRewritesFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::ForwardResultFn,Kernel::Clause*>>,Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>>,Lib::NonzeroFn,false>>>
            ((Lib *)this,&local_120);
  Lib::
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  ::~CatIterator(&local_120._iter._inn);
  Lib::
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  ::~CatIterator((CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
                  *)local_4e0);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_380._inner);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_220._inner);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_328._inner);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_1a0._inner);
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator SubVarSup::generateClauses(Clause* premise)
{
  //cout << "SubVarSup with " << premise->toString() << endl;

  auto itf = iterTraits(premise->getSelectedLiteralIterator())
  // Get an iterator of pairs of selected literals and rewritable subterms of those literals
  // A subterm is rewritable (see EqHelper) if
  //  a) The literal is a positive equality t1=t2 and the subterm is max(t1,t2) wrt ordering
  //  b) The subterm is not a variable
     .flatMap(RewriteableSubtermsFn(_salg->getOrdering(), premise))

  // Get clauses with a literal whose complement unifies with the rewritable subterm,
  // returns a pair with the original pair and the unification result (includes substitution)
     .flatMap(ApplicableRewritesFn(_lhsIndex))

  //Perform forward SubVarSup
     .map(ForwardResultFn(premise, *this));

  auto itb = iterTraits(premise->getSelectedLiteralIterator())
             .flatMap(EqHelper::SubVarSupLHSIteratorFn(_salg->getOrdering()))
             .flatMap(RewritableResultsFn(_subtermIndex))
  //Perform backward SubVarSup
             .map(BackwardResultFn(premise, *this));

  // Add the results of forward and backward together
  return pvi(concatIters(std::move(itf),std::move(itb))
  // Remove null elements - these can come from performSubVarSup
          .filter(NonzeroFn()));
}